

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis<double,unsigned_long,double>
                 (size_t col_num,size_t nrows,double *Xc,unsigned_long *Xc_ind,
                 unsigned_long *Xc_indptr,MissingAction missing_action)

{
  ulong uVar1;
  bool bVar2;
  unsigned_long ix_1;
  ulong uVar3;
  unsigned_long ix;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_90;
  double local_88;
  double local_80;
  ulong local_40;
  
  uVar3 = Xc_indptr[col_num];
  uVar1 = Xc_indptr[col_num + 1];
  if (1 < nrows && uVar3 != uVar1) {
    local_40 = nrows;
    if (missing_action == Fail) {
      dVar7 = 0.0;
      local_80 = 0.0;
      local_90 = 0.0;
      local_88 = 0.0;
      for (; uVar3 < uVar1; uVar3 = uVar3 + 1) {
        dVar8 = Xc[uVar3];
        dVar6 = dVar8 * dVar8;
        local_88 = local_88 + dVar8;
        local_90 = fma(dVar8,dVar8,local_90);
        local_80 = fma(dVar6,dVar8,local_80);
        dVar7 = fma(dVar6,dVar6,dVar7);
      }
    }
    else {
      dVar7 = 0.0;
      local_80 = 0.0;
      local_90 = 0.0;
      local_88 = 0.0;
      for (uVar4 = uVar3; uVar4 < uVar1; uVar4 = uVar4 + 1) {
        dVar8 = Xc[uVar4];
        if ((ulong)ABS(dVar8) < 0x7ff0000000000000) {
          dVar6 = dVar8 * dVar8;
          local_88 = local_88 + dVar8;
          local_90 = fma(dVar8,dVar8,local_90);
          local_80 = fma(dVar6,dVar8,local_80);
          dVar7 = fma(dVar6,dVar6,dVar7);
        }
        else {
          local_40 = local_40 - 1;
        }
      }
      if (local_40 <= (uVar3 + nrows) - uVar1) {
        return -INFINITY;
      }
    }
    if ((1 < local_40) && ((local_90 != 0.0 || (NAN(local_90))))) {
      if ((local_90 != local_88 * local_88) || (NAN(local_90) || NAN(local_88 * local_88))) {
        auVar5._8_4_ = (int)(local_40 >> 0x20);
        auVar5._0_8_ = local_40;
        auVar5._12_4_ = 0x45300000;
        dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0);
        dVar10 = local_88 / dVar6;
        dVar8 = dVar10 * dVar10;
        dVar9 = local_90 / dVar6 - dVar8;
        if ((!NAN(dVar9)) &&
           ((2.220446049250313e-16 < dVar9 ||
            (bVar2 = check_more_than_two_unique_values<double,unsigned_long>
                               (nrows,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar2)))) {
          if (dVar9 <= 0.0) {
            return 0.0;
          }
          dVar7 = (dVar8 * dVar10 * dVar10 * dVar6 +
                  local_88 * -4.0 * dVar8 * dVar10 +
                  local_90 * 6.0 * dVar8 + local_80 * -4.0 * dVar10 + dVar7) /
                  (dVar9 * dVar9 * dVar6);
          if ((long)ABS(dVar7) < 0x7ff0000000000000) {
            if (dVar7 <= 0.0) {
              return 0.0;
            }
            return dVar7;
          }
          return -INFINITY;
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis(size_t col_num, size_t nrows,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = nrows;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            if (unlikely(is_na_or_inf(xval)))
            {
                cnt--;
            }

            else
            {
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);
            }
        }

        if (cnt <= (nrows) - (Xc_indptr[col_num+1] - Xc_indptr[col_num])) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            x_sq = square(xval);
            s1 += xval;
            s2  = std::fma(xval, xval, s2);
            s3  = std::fma(x_sq, xval, s3);
            s4  = std::fma(x_sq, x_sq, s4);
            // s1 += pw1(xval);
            // s2 += pw2(xval);
            // s3 += pw3(xval);
            // s4 += pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}